

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_tracker_connection.cpp
# Opt level: O3

void __thiscall
libtorrent::aux::udp_tracker_connection::send_udp_announce(udp_tracker_connection *this)

{
  void *pvVar1;
  event_t eVar2;
  session_settings *this_00;
  ulong uVar3;
  address *__s;
  byte bVar4;
  ushort uVar7;
  ushort uVar8;
  ushort uVar9;
  short sVar10;
  ushort uVar11;
  undefined8 uVar12;
  byte bVar13;
  int iVar14;
  long val;
  iterator iVar15;
  string *psVar16;
  int *piVar17;
  long lVar18;
  error_code *peVar19;
  long val_1;
  char *pcVar20;
  size_t __n;
  char cVar21;
  address *__cp;
  error_code *in_R8;
  long lVar22;
  size_type sVar23;
  uint val_5;
  uint uVar24;
  bool bVar25;
  undefined1 auVar26 [16];
  string_view url;
  span<const_char> in;
  span<const_char> p;
  string request_string;
  shared_ptr<libtorrent::aux::request_callback> cb;
  error_code ec;
  address ip;
  per_timer_data **local_3c0;
  per_timer_data *local_3b0 [4];
  void *local_390 [2];
  prop_fns<boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  *local_380;
  prop_fns<boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  local_370;
  char buf [800];
  byte bVar5;
  byte bVar6;
  
  if (this->m_abort != false) {
    return;
  }
  bVar25 = (this->m_target).impl_.data_.base.sa_family != 2;
  if (bVar25) {
    uVar12 = *(undefined8 *)((long)&(this->m_target).impl_.data_ + 8);
    ip.ipv6_address_.addr_.__in6_u._8_8_ =
         *(undefined8 *)((long)&(this->m_target).impl_.data_ + 0x10);
    ip.ipv6_address_.addr_.__in6_u.__u6_addr8[0] = (uint8_t)uVar12;
    ip.ipv6_address_.addr_.__in6_u._1_7_ = (undefined7)((ulong)uVar12 >> 8);
    ip.ipv6_address_.scope_id_ = (unsigned_long)(this->m_target).impl_.data_.v6.sin6_scope_id;
    ip.ipv4_address_.addr_.s_addr = (in4_addr_type)0;
  }
  else {
    ip.ipv4_address_.addr_.s_addr = (in4_addr_type)(this->m_target).impl_.data_.v4.sin_addr.s_addr;
    ip.ipv6_address_.addr_.__in6_u.__u6_addr8[0] = '\0';
    ip.ipv6_address_.addr_.__in6_u._1_7_ = 0;
    ip.ipv6_address_.addr_.__in6_u._8_8_ = 0;
    ip.ipv6_address_.scope_id_ = 0;
  }
  ip.type_ = (anon_enum_32)bVar25;
  this_00 = ((this->super_tracker_connection).m_man)->m_settings;
  iVar15 = ::std::
           _Rb_tree<boost::asio::ip::address,_std::pair<const_boost::asio::ip::address,_libtorrent::aux::udp_tracker_connection::connection_cache_entry>,_std::_Select1st<std::pair<const_boost::asio::ip::address,_libtorrent::aux::udp_tracker_connection::connection_cache_entry>_>,_std::less<boost::asio::ip::address>,_std::allocator<std::pair<const_boost::asio::ip::address,_libtorrent::aux::udp_tracker_connection::connection_cache_entry>_>_>
           ::find((_Rb_tree<boost::asio::ip::address,_std::pair<const_boost::asio::ip::address,_libtorrent::aux::udp_tracker_connection::connection_cache_entry>,_std::_Select1st<std::pair<const_boost::asio::ip::address,_libtorrent::aux::udp_tracker_connection::connection_cache_entry>_>,_std::less<boost::asio::ip::address>,_std::allocator<std::pair<const_boost::asio::ip::address,_libtorrent::aux::udp_tracker_connection::connection_cache_entry>_>_>
                   *)m_connection_cache,&ip);
  if (iVar15._M_node == (_Base_ptr)(m_connection_cache + 8)) {
    return;
  }
  lVar22 = *(long *)(iVar15._M_node + 2);
  lVar18 = 0x38;
  pcVar20 = buf;
  do {
    *pcVar20 = (char)(lVar22 >> ((byte)lVar18 & 0x3f));
    lVar18 = lVar18 + -8;
    pcVar20 = pcVar20 + 1;
  } while (lVar18 != -8);
  pcVar20 = buf + 0x38;
  buf[8] = '\0';
  buf[9] = '\0';
  buf[10] = '\0';
  buf[0xb] = '\x01';
  uVar24 = this->m_transaction_id;
  uVar8 = (ushort)(uVar24 >> 0x10) & 0xff;
  uVar9 = (ushort)(uVar24 >> 8) & 0xff;
  uVar11 = (ushort)uVar24 & 0xff;
  bVar13 = (byte)(uVar24 >> 0x18);
  uVar7 = (ushort)bVar13;
  bVar4 = (uVar7 != 0) * (uVar7 < 0x100) * bVar13 - (0xff < uVar7);
  bVar13 = ((uVar24 & 0xff0000) != 0) * (uVar8 < 0x100) * (char)(uVar24 >> 0x10) - (0xff < uVar8);
  bVar5 = ((uVar24 & 0xff00) != 0) * (uVar9 < 0x100) * (char)(uVar24 >> 8) - (0xff < uVar9);
  bVar6 = ((uVar24 & 0xff) != 0) * (uVar11 < 0x100) * (char)uVar24 - (0xff < uVar11);
  buf[0xd] = (bVar13 != 0) * (bVar13 < 0x100) * bVar13 - (0xff < bVar13);
  buf[0xc] = (bVar4 != 0) * (bVar4 < 0x100) * bVar4 - (0xff < bVar4);
  buf[0xe] = (bVar5 != 0) * (bVar5 < 0x100) * bVar5 - (0xff < bVar5);
  buf[0xf] = (bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6);
  buf._32_4_ = (this->super_tracker_connection).m_req.info_hash.m_number._M_elems[4];
  buf._16_8_ = *(undefined8 *)(this->super_tracker_connection).m_req.info_hash.m_number._M_elems;
  buf._24_8_ = *(undefined8 *)
                ((this->super_tracker_connection).m_req.info_hash.m_number._M_elems + 2);
  buf._52_4_ = (this->super_tracker_connection).m_req.pid.m_number._M_elems[4];
  buf._36_8_ = *(undefined8 *)(this->super_tracker_connection).m_req.pid.m_number._M_elems;
  buf._44_8_ = *(undefined8 *)((this->super_tracker_connection).m_req.pid.m_number._M_elems + 2);
  lVar22 = (this->super_tracker_connection).m_req.downloaded;
  lVar18 = 0x38;
  do {
    *pcVar20 = (char)(lVar22 >> ((byte)lVar18 & 0x3f));
    lVar18 = lVar18 + -8;
    pcVar20 = pcVar20 + 1;
  } while (lVar18 != -8);
  pcVar20 = buf + 0x40;
  lVar22 = (this->super_tracker_connection).m_req.left;
  lVar18 = 0x38;
  do {
    *pcVar20 = (char)(lVar22 >> ((byte)lVar18 & 0x3f));
    lVar18 = lVar18 + -8;
    pcVar20 = pcVar20 + 1;
  } while (lVar18 != -8);
  pcVar20 = buf + 0x48;
  lVar22 = (this->super_tracker_connection).m_req.uploaded;
  lVar18 = 0x38;
  do {
    *pcVar20 = (char)(lVar22 >> ((byte)lVar18 & 0x3f));
    lVar18 = lVar18 + -8;
    pcVar20 = pcVar20 + 1;
  } while (lVar18 != -8);
  eVar2 = (this->super_tracker_connection).m_req.event;
  auVar26 = ZEXT116(eVar2) << 0x60;
  sVar10 = auVar26._8_2_;
  cVar21 = (0 < sVar10) * (sVar10 < 0x100) * auVar26[8] - (0xff < sVar10);
  sVar10 = auVar26._10_2_;
  sVar10 = CONCAT11((0 < sVar10) * (sVar10 < 0x100) * auVar26[10] - (0xff < sVar10),cVar21);
  bVar13 = (eVar2 != none) * (eVar2 < 0x100) * eVar2 - (0xff < eVar2);
  buf._80_4_ = (uint)CONCAT11((bVar13 != 0) * (bVar13 < 0x100) * bVar13 - (0xff < bVar13),
                              (0 < sVar10) * (sVar10 < 0x100) * cVar21 - (0xff < sVar10)) << 0x10;
  ip._0_8_ = &this_00->m_mutex;
  ip.ipv6_address_.addr_.__in6_u.__u6_addr8[0] = '\0';
  ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&ip);
  ip.ipv6_address_.addr_.__in6_u.__u6_addr8[0] = '\x01';
  uVar3 = (this_00->m_store).m_bools.super__Base_bitset<2UL>._M_w[0];
  ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&ip);
  uVar24 = 0;
  lVar22 = ip._0_8_;
  if ((uVar3 >> 0x26 & 1) != 0) goto LAB_0037d63e;
  psVar16 = session_settings::get_str_abi_cxx11_(this_00,1);
  uVar24 = 0;
  lVar22 = ip._0_8_;
  if (psVar16->_M_string_length == 0) goto LAB_0037d63e;
  psVar16 = session_settings::get_str_abi_cxx11_(this_00,1);
  __s = (address *)(psVar16->_M_dataplus)._M_p;
  piVar17 = __errno_location();
  *piVar17 = 0;
  pcVar20 = strchr((char *)__s,0x25);
  __cp = __s;
  if (pcVar20 == (char *)0x0) {
LAB_0037d577:
    iVar14 = inet_pton(10,(char *)__cp,&request_string);
    bVar25 = *piVar17 != 0;
    if (iVar14 < 1) goto LAB_0037d5bb;
    lVar22 = ip._0_8_;
    if ((((pcVar20 != (char *)0x0) && ((char)request_string._M_dataplus._M_p != -2)) &&
        ((char)request_string._M_dataplus._M_p == -1)) &&
       ((request_string._M_dataplus._M_p._1_1_ & 0xf) == 2)) {
      if_nametoindex(pcVar20 + 1);
      lVar22 = ip._0_8_;
    }
  }
  else {
    __n = (long)pcVar20 - (long)__s;
    if ((long)__n < 0x40) {
      memcpy(&ip,__s,__n);
      *(undefined1 *)((long)&ip + __n) = 0;
      __cp = &ip;
      goto LAB_0037d577;
    }
LAB_0037d5bb:
    bVar25 = true;
    lVar22 = ip._0_8_;
  }
  uVar24 = 0;
  if (bVar25) {
    *piVar17 = 0;
    ip._0_8_ = lVar22;
    iVar14 = inet_pton(2,(char *)__s,&ip);
    if ((iVar14 < 1) || (*piVar17 != 0)) {
      ip.ipv4_address_.addr_.s_addr = (in4_addr_type)0;
      bVar13 = 0;
    }
    else {
      ip.ipv4_address_.addr_.s_addr = (in4_addr_type)(in4_addr_type)ip.type_;
      bVar13 = 1;
    }
    ip.ipv6_address_.scope_id_ = 0;
    ip.ipv6_address_.addr_.__in6_u._8_8_ = 0;
    ip.ipv6_address_.addr_.__in6_u._1_7_ = 0;
    ip.ipv6_address_.addr_.__in6_u.__u6_addr8[0] = '\0';
    ip.type_ = ipv4;
    lVar22 = (ulong)(uint)ip.ipv4_address_.addr_.s_addr << 0x20;
    if ((bool)(bVar13 & bVar25)) {
      boost::asio::ip::address::to_v4((address *)&request_string);
      lVar22 = CONCAT44(ip.ipv4_address_.addr_.s_addr,ip.type_);
      uVar24 = (uint)request_string._M_dataplus._M_p;
    }
  }
LAB_0037d63e:
  uVar7 = (ushort)uVar24 & 0xff;
  bVar4 = ((uVar24 & 0xff) != 0) * (uVar7 < 0x100) * (char)uVar24 - (0xff < uVar7);
  uVar7 = (ushort)((uVar24 & 0xff00) >> 8);
  bVar5 = (uVar7 != 0) * (uVar7 < 0x100) * (char)((uVar24 & 0xff00) >> 8) - (0xff < uVar7);
  uVar7 = (ushort)((uVar24 & 0xff0000) >> 0x10);
  bVar13 = (uVar7 != 0) * (uVar7 < 0x100) * (char)((uVar24 & 0xff0000) >> 0x10) - (0xff < uVar7);
  bVar6 = (byte)(uVar24 >> 0x18);
  uVar7 = (ushort)bVar6;
  bVar6 = (uVar7 != 0) * (uVar7 < 0x100) * bVar6 - (0xff < uVar7);
  buf[0x55] = (bVar5 != 0) * (bVar5 < 0x100) * bVar5 - (0xff < bVar5);
  buf[0x54] = (bVar4 != 0) * (bVar4 < 0x100) * bVar4 - (0xff < bVar4);
  buf[0x56] = (bVar13 != 0) * (bVar13 < 0x100) * bVar13 - (0xff < bVar13);
  buf[0x57] = (bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6);
  uVar24 = (this->super_tracker_connection).m_req.key;
  uVar8 = (ushort)(uVar24 >> 0x10) & 0xff;
  uVar9 = (ushort)(uVar24 >> 8) & 0xff;
  uVar11 = (ushort)uVar24 & 0xff;
  bVar13 = (byte)(uVar24 >> 0x18);
  uVar7 = (ushort)bVar13;
  bVar13 = (uVar7 != 0) * (uVar7 < 0x100) * bVar13 - (0xff < uVar7);
  bVar6 = ((uVar24 & 0xff0000) != 0) * (uVar8 < 0x100) * (char)(uVar24 >> 0x10) - (0xff < uVar8);
  bVar5 = ((uVar24 & 0xff00) != 0) * (uVar9 < 0x100) * (char)(uVar24 >> 8) - (0xff < uVar9);
  bVar4 = ((uVar24 & 0xff) != 0) * (uVar11 < 0x100) * (char)uVar24 - (0xff < uVar11);
  buf[0x59] = (bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6);
  buf[0x58] = (bVar13 != 0) * (bVar13 < 0x100) * bVar13 - (0xff < bVar13);
  buf[0x5a] = (bVar5 != 0) * (bVar5 < 0x100) * bVar5 - (0xff < bVar5);
  buf[0x5b] = (bVar4 != 0) * (bVar4 < 0x100) * bVar4 - (0xff < bVar4);
  uVar24 = (this->super_tracker_connection).m_req.num_want;
  uVar8 = (ushort)(uVar24 >> 0x10) & 0xff;
  uVar9 = (ushort)(uVar24 >> 8) & 0xff;
  uVar11 = (ushort)uVar24 & 0xff;
  bVar13 = (byte)(uVar24 >> 0x18);
  uVar7 = (ushort)bVar13;
  bVar13 = (uVar7 != 0) * (uVar7 < 0x100) * bVar13 - (0xff < uVar7);
  bVar6 = ((uVar24 & 0xff0000) != 0) * (uVar8 < 0x100) * (char)(uVar24 >> 0x10) - (0xff < uVar8);
  bVar5 = ((uVar24 & 0xff00) != 0) * (uVar9 < 0x100) * (char)(uVar24 >> 8) - (0xff < uVar9);
  bVar4 = ((uVar24 & 0xff) != 0) * (uVar11 < 0x100) * (char)uVar24 - (0xff < uVar11);
  buf[0x5d] = (bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6);
  buf[0x5c] = (bVar13 != 0) * (bVar13 < 0x100) * bVar13 - (0xff < bVar13);
  buf[0x5e] = (bVar5 != 0) * (bVar5 < 0x100) * bVar5 - (0xff < bVar5);
  buf[0x5f] = (bVar4 != 0) * (bVar4 < 0x100) * bVar4 - (0xff < bVar4);
  uVar7 = (this->super_tracker_connection).m_req.listen_port;
  buf._96_2_ = uVar7 << 8 | uVar7 >> 8;
  request_string._M_string_length = 0;
  request_string.field_2._M_local_buf[0] = '\0';
  ec.val_ = 0;
  ec.failed_ = false;
  ec.cat_ = &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
  url._M_str = (char *)&ec;
  url._M_len = (size_t)(this->super_tracker_connection).m_req.url._M_dataplus._M_p;
  peVar19 = &ec;
  request_string._M_dataplus._M_p = (pointer)&request_string.field_2;
  ip._0_8_ = lVar22;
  parse_url_components_abi_cxx11_
            ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&ip,(aux *)(this->super_tracker_connection).m_req.url._M_string_length,url,in_R8);
  ::std::__cxx11::string::operator=((string *)&request_string,(string *)&ip);
  if (local_380 != &local_370) {
    operator_delete(local_380,(ulong)(local_370.query + 1));
  }
  if (local_3b0[2] != (per_timer_data *)local_390) {
    operator_delete(local_3b0[2],(long)local_390[0] + 1);
  }
  if (local_3c0 != local_3b0) {
    operator_delete(local_3c0,(ulong)((long)&(local_3b0[0]->op_queue_).front_ + 1));
  }
  pvVar1 = (void *)((long)&ip.ipv6_address_.addr_.__in6_u + 8);
  if ((void *)ip._0_8_ != pvVar1) {
    operator_delete((void *)ip._0_8_,ip.ipv6_address_.addr_.__in6_u._8_8_ + 1);
  }
  if (ec.failed_ == true) {
    request_string._M_string_length = 0;
    *request_string._M_dataplus._M_p = '\0';
  }
  if (request_string._M_string_length == 0) {
    lVar22 = 0x2be;
  }
  else {
    sVar23 = 0xff;
    if (request_string._M_string_length < 0xff) {
      sVar23 = request_string._M_string_length;
    }
    cVar21 = (char)sVar23;
    ::std::__cxx11::string::resize((ulong)&request_string,cVar21);
    sVar23 = request_string._M_string_length;
    buf[0x62] = '\x02';
    buf[99] = cVar21;
    if (request_string._M_string_length == 0) {
      lVar22 = 700;
    }
    else {
      memmove(buf + 100,request_string._M_dataplus._M_p,request_string._M_string_length);
      lVar22 = 700 - (long)(int)sVar23;
    }
  }
  tracker_connection::requester((tracker_connection *)&cb);
  if (cb.super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    iVar14 = (*(cb.super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr)->_vptr_request_callback[6])();
    if ((char)iVar14 != '\0') {
      in.m_len = (difference_type)peVar19;
      in.m_ptr = (char *)0x14;
      to_hex_abi_cxx11_((string *)&ip,(aux *)&(this->super_tracker_connection).m_req.info_hash,in);
      (*(cb.super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        )->_vptr_request_callback[7])
                (cb.
                 super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,"==> UDP_TRACKER_ANNOUNCE [%s]",ip._0_8_);
      if ((void *)ip._0_8_ != pvVar1) {
        operator_delete((void *)ip._0_8_,ip.ipv6_address_.addr_.__in6_u._8_8_ + 1);
      }
    }
  }
  if ((this->m_hostname)._M_string_length == 0) {
    tracker_manager::send
              ((this->super_tracker_connection).m_man,(int)this + 0x188,&this->m_target,(size_t)buf,
               800 - (int)lVar22);
  }
  else {
    uVar7 = (this->m_target).impl_.data_.v4.sin_port;
    p.m_len = 800 - lVar22;
    p.m_ptr = buf;
    tracker_manager::send_hostname
              ((this->super_tracker_connection).m_man,
               &(this->super_tracker_connection).m_req.outgoing_socket,
               (this->m_hostname)._M_dataplus._M_p,(uint)(ushort)(uVar7 << 8 | uVar7 >> 8),p,&ec,
               (udp_send_flags_t)0x2);
  }
  this->m_state = announce;
  tracker_connection::sent_bytes(&this->super_tracker_connection,0x33c - (int)lVar22);
  this->m_attempts = this->m_attempts + 1;
  if (ec.failed_ == true) {
    fail(this,&ec,sock_write,"",(seconds32)0x0,(seconds32)0x1e);
  }
  if (cb.super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (cb.super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)request_string._M_dataplus._M_p != &request_string.field_2) {
    operator_delete(request_string._M_dataplus._M_p,
                    CONCAT71(request_string.field_2._M_allocated_capacity._1_7_,
                             request_string.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void udp_tracker_connection::send_udp_announce()
	{
		if (m_abort) return;

		char buf[800];
		span<char> out = buf;

		tracker_request const& req = tracker_req();
		aux::session_settings const& settings = m_man.settings();

		auto const i = m_connection_cache.find(m_target.address());
		// this isn't really supposed to happen
		TORRENT_ASSERT(i != m_connection_cache.end());
		if (i == m_connection_cache.end()) return;

		aux::write_int64(i->second.connection_id, out); // connection_id
		aux::write_int32(action_t::announce, out); // action (announce)
		aux::write_int32(m_transaction_id, out); // transaction_id
		std::copy(req.info_hash.begin(), req.info_hash.end(), out.data()); // info_hash
		out = out.subspan(20);
		std::copy(req.pid.begin(), req.pid.end(), out.data()); // peer_id
		out = out.subspan(20);
		aux::write_int64(req.downloaded, out); // downloaded
		aux::write_int64(req.left, out); // left
		aux::write_int64(req.uploaded, out); // uploaded
		aux::write_int32(req.event, out); // event
		// ip address
		address_v4 announce_ip;

		if (!settings.get_bool(settings_pack::anonymous_mode)
			&& !settings.get_str(settings_pack::announce_ip).empty())
		{
			error_code ec;
			address ip = make_address(settings.get_str(settings_pack::announce_ip).c_str(), ec);
			if (!ec && ip.is_v4()) announce_ip = ip.to_v4();
		}
		aux::write_uint32(announce_ip.to_uint(), out);
		aux::write_int32(req.key, out); // key
		aux::write_int32(req.num_want, out); // num_want
		aux::write_uint16(req.listen_port, out); // port

		std::string request_string;
		error_code ec;
		using std::ignore;
		std::tie(ignore, ignore, ignore, ignore, request_string)
			= parse_url_components(req.url, ec);
		if (ec) request_string.clear();

		if (!request_string.empty())
		{
			std::size_t str_len = std::min(request_string.size(), std::size_t(255));
			request_string.resize(str_len);

			aux::write_uint8(2, out);
			aux::write_uint8(str_len, out);
			aux::write_string(request_string, out);
		}

#ifndef TORRENT_DISABLE_LOGGING
		std::shared_ptr<request_callback> cb = requester();
		if (cb && cb->should_log())
		{
			cb->debug_log("==> UDP_TRACKER_ANNOUNCE [%s]", aux::to_hex(req.info_hash).c_str());
		}
#endif

		if (!m_hostname.empty())
		{
			m_man.send_hostname(bind_socket(), m_hostname.c_str()
				, m_target.port(), {buf, int(sizeof(buf)) - out.size()}, ec
				, udp_socket::tracker_connection);
		}
		else
		{
			m_man.send(bind_socket(), m_target, {buf, int(sizeof(buf)) - out.size()}, ec
				, udp_socket::tracker_connection);
		}
		m_state = action_t::announce;
		sent_bytes(int(sizeof(buf)) - int(out.size()) + 28); // assuming UDP/IP header
		++m_attempts;
		if (ec)
		{
			fail(ec, operation_t::sock_write);
			return;
		}
	}